

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::Dummy(ImVec2 *size)

{
  ImGuiWindow *pIVar1;
  ImRect bb;
  ImVec2 local_20;
  ImRect local_18;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    local_18.Min.x = (pIVar1->DC).CursorPos.x;
    local_18.Min.y = (pIVar1->DC).CursorPos.y;
    local_18.Max.x = (*size).x + local_18.Min.x;
    local_18.Max.y = (*size).y + local_18.Min.y;
    local_20.x = local_18.Max.x - local_18.Min.x;
    local_20.y = local_18.Max.y - local_18.Min.y;
    ItemSize(&local_20,0.0);
    ItemAdd(&local_18,(ImGuiID *)0x0);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }